

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

bool Js::JavascriptOperators::GetAndAssertIsConstructorSuperCall(Arguments *args)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  Var pvVar5;
  undefined4 *puVar6;
  RecyclableObject *this;
  Type TVar7;
  Arguments local_40;
  
  local_40.Info = args->Info;
  local_40.Values = args->Values;
  bVar2 = IsConstructorSuperCall(&local_40);
  if ((!bVar2) && (((args->Info).field_0x3 & 1) != 0)) {
    pvVar5 = Arguments::operator[](args,0);
    if (pvVar5 == (Var)0x0) {
      return bVar2;
    }
    pvVar5 = Arguments::operator[](args,0);
    if (pvVar5 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00ab62d8;
      *puVar6 = 0;
    }
    if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00ab62d8;
      *puVar6 = 0;
    }
    TVar7 = TypeIds_FirstNumberType;
    if ((((ulong)pvVar5 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar7 = TypeIds_Number, (ulong)pvVar5 >> 0x32 == 0)) {
      this = UnsafeVarTo<Js::RecyclableObject>(pvVar5);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00ab62d8;
        *puVar6 = 0;
      }
      TVar7 = ((this->type).ptr)->typeId;
      if ((0x57 < (int)TVar7) && (BVar4 = RecyclableObject::IsExternal(this), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_00ab62d8;
        *puVar6 = 0;
      }
    }
    if (TVar7 != TypeIds_HostDispatch) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x614,
                                  "(isCtorSuperCall || !args.IsNewCall() || args[0] == nullptr || JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)"
                                  ,
                                  "isCtorSuperCall || !args.IsNewCall() || args[0] == nullptr || JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch"
                                 );
      if (!bVar3) {
LAB_00ab62d8:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
  }
  return bVar2;
}

Assistant:

bool JavascriptOperators::GetAndAssertIsConstructorSuperCall(Arguments args)
    {
        bool isCtorSuperCall = JavascriptOperators::IsConstructorSuperCall(args);
        Assert(isCtorSuperCall || !args.IsNewCall()
                || args[0] == nullptr || JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch);
        return isCtorSuperCall;
    }